

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_3_6d7b35ba_for_proto *pp;
  int *piVar1;
  ftpstate instate;
  byte bVar2;
  char cVar3;
  uchar uVar4;
  bool bVar5;
  _Bool _Var6;
  CURLcode CVar7;
  CURLcode CVar8;
  int iVar9;
  char *pcVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  undefined8 uVar14;
  char *fmt;
  size_t sVar15;
  int ftpcode;
  size_t nread;
  _Bool done;
  uint local_5c;
  size_t local_58;
  dynbuf local_50;
  
  pp = &conn->proto;
  local_58 = 0;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar7 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar7;
  }
  CVar7 = ftp_readresp(data,conn->sock[0],&(pp->ftpc).pp,(int *)&local_5c,&local_58);
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  CVar7 = CURLE_OK;
  if (local_5c == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case '\x01':
    if (local_5c != 0xdc) {
      if (local_5c != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected",(ulong)local_5c);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((data->set).use_ssl < 2) || (((conn->bits).field_0x2 & 0x10) != 0)) {
        CVar7 = ftp_state_user_resp(data,0xe6);
        return CVar7;
      }
    }
    if (((data->set).use_ssl != '\0') && (((conn->bits).field_0x2 & 0x10) == 0)) {
      (conn->proto).ftpc.count3 = 0;
      bVar2 = (data->set).ftpsslauth;
      if (2 < bVar2) {
        Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar9 = *(int *)(&DAT_00176060 + (ulong)(uint)bVar2 * 4);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_00176054 + (ulong)bVar2 * 4);
      (conn->proto).ftpc.count1 = iVar9;
      CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth[iVar9]);
      if (CVar7 == CURLE_OK) {
        (data->conn->proto).ftpc.state = '\x02';
        return CURLE_OK;
      }
      return CVar7;
    }
LAB_001333ab:
    CVar7 = ftp_state_user(data,conn);
    break;
  case '\x02':
    if ((conn->proto).ftpc.pp.overflow != 0) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((local_5c == 0x14e) || (local_5c == 0xea)) {
      _Var6 = Curl_conn_is_ssl(conn,0);
      if (!_Var6) {
        bVar5 = false;
        CVar7 = Curl_ssl_cfilter_add(data,conn,0);
        if (CVar7 != CURLE_OK) goto LAB_00132f63;
      }
      CVar7 = Curl_conn_connect(data,0,true,(_Bool *)&local_50);
      bVar5 = true;
      if (CVar7 == CURLE_OK) {
        conn->bits = (ConnectBits)((uint)conn->bits & 0xffe7ffff | 0x100000);
        CVar7 = ftp_state_user(data,conn);
      }
LAB_00132f63:
      if (!bVar5) {
        return CURLE_USE_SSL_FAILED;
      }
      return CVar7;
    }
    iVar9 = (conn->proto).ftpc.count3;
    if (0 < iVar9) {
      if (1 < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_001333ab;
    }
    (conn->proto).ftpc.count3 = iVar9 + 1;
    lVar12 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar12;
    pcVar10 = ftp_statemachine::ftpauth[lVar12];
    fmt = "AUTH %s";
    goto LAB_00133168;
  case '\x03':
  case '\x04':
    CVar7 = ftp_state_user_resp(data,local_5c);
    break;
  case '\x05':
    CVar7 = ftp_state_acct_resp(data,local_5c);
    break;
  case '\x06':
    uVar14 = 0x50;
    if ((data->set).use_ssl == '\x02') {
      uVar14 = 0x43;
    }
    CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PROT %c",uVar14);
    if (CVar7 == CURLE_OK) {
      (data->conn->proto).ftpc.state = '\a';
      CVar7 = CURLE_OK;
    }
    break;
  case '\a':
    bVar2 = (data->set).use_ssl;
    if (local_5c - 200 < 100) {
      conn->bits = (ConnectBits)((uint)conn->bits & 0xfff7ffff | (uint)(bVar2 != 2) << 0x13);
    }
    else if (2 < bVar2) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc != '\0') {
      CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","CCC");
      if (CVar7 == CURLE_OK) {
        (data->conn->proto).ftpc.state = '\b';
        return CURLE_OK;
      }
      return CVar7;
    }
    goto LAB_001332a0;
  case '\b':
    CVar7 = CURLE_OK;
    if ((int)local_5c < 500) {
      CVar8 = Curl_ssl_cfilter_remove(data,0);
      CVar7 = CURLE_OK;
      if (CVar8 != CURLE_OK) {
        Curl_failf(data,"Failed to clear the command channel (CCC)");
        CVar7 = CVar8;
      }
    }
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
LAB_001332a0:
    CVar8 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","PWD");
    CVar7 = CVar8;
LAB_001332bd:
    if (CVar8 == CURLE_OK) {
      (data->conn->proto).ftpc.state = '\t';
    }
    break;
  case '\t':
    CVar7 = CURLE_OK;
    if (local_5c == 0x101) {
      pcVar10 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      Curl_dyn_init(&local_50,1000);
      for (pcVar10 = pcVar10 + 4; (cVar3 = *pcVar10, cVar3 != '\0' && (cVar3 != '\n'));
          pcVar10 = pcVar10 + 1) {
        if (cVar3 == '\"') {
          goto LAB_00133342;
        }
      }
LAB_0013353e:
      Curl_dyn_free(&local_50);
      iVar9 = 0;
      if (data != (Curl_easy *)0x0) {
        CVar7 = CURLE_OK;
        if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_00133574;
        Curl_infof(data,"Failed to figure out path");
      }
LAB_00133572:
      iVar9 = 0;
      CVar7 = CURLE_OK;
      goto LAB_00133574;
    }
  default:
switchD_00132d06_default:
    (data->conn->proto).ftpc.state = '\0';
    break;
  case '\n':
    CVar7 = CURLE_OK;
    if (local_5c == 0xd7) {
      pcVar10 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      pbVar11 = (byte *)(pcVar10 + 3);
      do {
        pbVar13 = pbVar11 + 1;
        pbVar11 = pbVar11 + 1;
      } while (*pbVar13 == 0x20);
      sVar15 = 0;
      for (pbVar13 = pbVar11; (*pbVar13 & 0xdf) != 0; pbVar13 = pbVar13 + 1) {
        sVar15 = sVar15 + 1;
      }
      pcVar10 = (char *)Curl_memdup0((char *)pbVar11,sVar15);
      iVar9 = 1;
      if (pcVar10 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        CVar7 = CURLE_OK;
      }
      else {
        iVar9 = curl_strequal(pcVar10,"OS/400");
        if (iVar9 == 0) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar10;
          iVar9 = 0;
          CVar7 = CURLE_OK;
          CVar8 = CURLE_OK;
        }
        else {
          CVar7 = CURLE_OK;
          CVar8 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
          if (CVar8 == CURLE_OK) {
            (*Curl_cfree)((conn->proto).ftpc.server_os);
            (conn->proto).ftpc.server_os = pcVar10;
            (data->conn->proto).ftpc.state = '\v';
            iVar9 = 2;
          }
          else {
            (*Curl_cfree)(pcVar10);
            iVar9 = 1;
            CVar7 = CVar8;
          }
        }
      }
      goto joined_r0x0013340d;
    }
    goto switchD_00132d06_default;
  case '\v':
    if (local_5c != 0xfa) goto switchD_00132d06_default;
    CVar8 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","PWD");
    CVar7 = CURLE_OK;
    goto LAB_001332bd;
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
    if (((int)local_5c < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar7 = ftp_state_quote(data,false,instate);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d",(ulong)local_5c);
      CVar7 = CURLE_QUOTE_ERROR;
    }
    break;
  case '\x10':
    if (99 < local_5c - 200) {
      uVar4 = (data->set).ftp_create_missing_dirs;
      if (((uVar4 != '\0') && (lVar12 = (long)(conn->proto).ftpc.cwdcount, lVar12 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        *(uint *)((long)&conn->proto + 0x108) = (uint)(uVar4 == '\x02');
        CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MKD %s",(conn->proto).ftpc.dirs[lVar12 + -1]);
        if (CVar7 == CURLE_OK) {
          (data->conn->proto).ftpc.state = '\x11';
          return CURLE_OK;
        }
        return CVar7;
      }
      Curl_failf(data,"Server denied you to change to the given directory");
      pbVar11 = (byte *)((long)&conn->proto + 0x112);
      *pbVar11 = *pbVar11 | 0x10;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar9 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar9 + 1;
    if ((conn->proto).ftpc.dirdepth <= iVar9) {
      CVar7 = ftp_state_mdtm(data);
      return CVar7;
    }
    pcVar10 = (conn->proto).ftpc.dirs[iVar9];
    goto LAB_00133161;
  case '\x11':
    if (99 < local_5c - 200) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar9 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar9 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d",(ulong)local_5c);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (data->conn->proto).ftpc.state = '\x10';
    pcVar10 = (conn->proto).ftpc.dirs[(long)(conn->proto).ftpc.cwdcount + -1];
LAB_00133161:
    fmt = "CWD %s";
LAB_00133168:
    CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,fmt,pcVar10);
    break;
  case '\x12':
    CVar7 = ftp_state_mdtm_resp(data,local_5c);
    break;
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
    CVar7 = ftp_state_type_resp(data,local_5c,instate);
    break;
  case '\x17':
  case '\x18':
  case '\x19':
    CVar7 = ftp_state_size_resp(data,local_5c,instate);
    break;
  case '\x1a':
  case '\x1b':
    CVar7 = ftp_state_rest_resp(data,conn,local_5c,instate);
    break;
  case '\x1c':
    CVar7 = ftp_state_port_resp(data,local_5c);
    break;
  case '\x1d':
    if (local_5c != 200) {
      Curl_failf(data,"PRET command not accepted: %03d",(ulong)local_5c);
      return CURLE_FTP_PRET_FAILED;
    }
    CVar7 = ftp_state_use_pasv(data,conn);
    break;
  case '\x1e':
    CVar7 = ftp_state_pasv_resp(data,local_5c);
    break;
  case '\x1f':
  case ' ':
    CVar7 = ftp_state_get_resp(data,local_5c,instate);
    break;
  case '!':
    CVar7 = ftp_state_stor_resp(data,local_5c,instate);
  }
  return CVar7;
LAB_00133342:
  do {
    if (pcVar10[1] == '\"') {
      if (pcVar10[2] != '\"') {
        sVar15 = Curl_dyn_len(&local_50);
        if (sVar15 == 0) goto LAB_0013353e;
        pcVar10 = Curl_dyn_ptr(&local_50);
        if (((conn->proto).ftpc.server_os != (char *)0x0) || (*pcVar10 == '/')) {
          (*Curl_cfree)((conn->proto).ftpc.entrypath);
          (conn->proto).ftpc.entrypath = pcVar10;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Entry path is \'%s\'",pcVar10);
          }
          (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
          goto LAB_00133572;
        }
        CVar7 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SYST");
        if (CVar7 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.entrypath);
          (conn->proto).ftpc.entrypath = pcVar10;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Entry path is \'%s\'",pcVar10);
          }
          (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
          (data->conn->proto).ftpc.state = '\n';
          CVar7 = CURLE_OK;
          iVar9 = 2;
          goto LAB_00133574;
        }
        (*Curl_cfree)(pcVar10);
        break;
      }
      pcVar10 = pcVar10 + 2;
    }
    else {
      if (pcVar10[1] == '\0') goto LAB_0013353e;
      pcVar10 = pcVar10 + 1;
    }
    CVar7 = Curl_dyn_addn(&local_50,pcVar10,1);
  } while (CVar7 == CURLE_OK);
  pcVar10 = (char *)(ulong)CVar7;
  iVar9 = 1;
LAB_00133574:
  CVar8 = (CURLcode)pcVar10;
joined_r0x0013340d:
  if (iVar9 == 2) {
    return CVar7;
  }
  if (iVar9 != 0) {
    return CVar8;
  }
  goto switchD_00132d06_default;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char * const ftpauth[] = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We don't have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          ftp_state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->overflow)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* this was BLOCKING, keep it so for now */
        bool done;
        if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
          result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
          if(result) {
            /* we failed and bail out */
            return CURLE_USE_SSL_FAILED;
          }
        }
        result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, &done);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        ftp_state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          ftp_state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_cfilter_remove(data, FIRSTSOCKET);

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        bool entry_extracted = FALSE;
        struct dynbuf out;
        Curl_dyn_init(&out, 1000);

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(*ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          for(ptr++; *ptr; ptr++) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                result = Curl_dyn_addn(&out, &ptr[1], 1);
                ptr++;
              }
              else {
                /* end of path */
                if(Curl_dyn_len(&out))
                  entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              result = Curl_dyn_addn(&out, ptr, 1);
            if(result)
              return result;
          }
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */
          char *dir = Curl_dyn_ptr(&out);

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            ftp_state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          Curl_dyn_free(&out);
          infof(data, "Failed to figure out path");
        }
      }
      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        char *os;
        char *start;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(start = ptr; *ptr && *ptr != ' '; ptr++)
          ;
        os = Curl_memdup0(start, ptr - start);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Check for special servers here. */
        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          ftp_state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            ftp_state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        ftp_state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
    default:
      /* internal error */
      ftp_state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}